

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ht-spkitable.c
# Opt level: O2

int key_entry_cmp(void *arg,void *obj)

{
  long lVar1;
  int iVar2;
  uint uVar3;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  uVar3 = 1;
  if (*(int *)((long)arg + 0x14) == *(int *)((long)obj + 0x14)) {
    iVar2 = bcmp(arg,obj,0x14);
    if (iVar2 == 0) {
      iVar2 = bcmp((void *)((long)arg + 0x18),(void *)((long)obj + 0x18),0x5b);
      if (iVar2 == 0) {
        uVar3 = (uint)(*(long *)((long)arg + 0x78) != *(long *)((long)obj + 0x78));
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return uVar3;
  }
  __stack_chk_fail();
}

Assistant:

static int key_entry_cmp(const void *arg, const void *obj)
{
	const struct key_entry *param = arg;
	const struct key_entry *entry = obj;

	if (param->asn != entry->asn)
		return 1;
	if (memcmp(param->ski, entry->ski, sizeof(entry->ski)))
		return 1;
	if (memcmp(param->spki, entry->spki, sizeof(entry->spki)))
		return 1;
	if (param->socket != entry->socket)
		return 1;

	return 0;
}